

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.cpp
# Opt level: O3

void * SeanetThread(void *pParam)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  timeval *ptVar5;
  double *pdVar6;
  char *pcVar7;
  tm *ptVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  size_t sVar13;
  time_t tt;
  long lStack_1178;
  int local_116c;
  int local_1168;
  int local_1164;
  double local_1160;
  double local_1158;
  uint local_1150;
  char SOf [4];
  timeval local_1148;
  double distance;
  CHRONO chrono_period;
  uchar auxbuf [128];
  SEANET seanet;
  char szTemp [256];
  char szSaveFilePath [256];
  uchar scanline [2048];
  
  distance = 0.0;
  memset(&seanet,0,0x5f0);
  local_1148.tv_sec = 0;
  local_1148.tv_usec = 0;
  local_1160 = 0.0;
  memset(scanline,0,0x800);
  auxbuf[0] = '\0';
  auxbuf[1] = '\0';
  auxbuf[2] = '\0';
  auxbuf[3] = '\0';
  auxbuf[4] = '\0';
  auxbuf[5] = '\0';
  auxbuf[6] = '\0';
  auxbuf[7] = '\0';
  auxbuf[8] = '\0';
  auxbuf[9] = '\0';
  auxbuf[10] = '\0';
  auxbuf[0xb] = '\0';
  auxbuf[0xc] = '\0';
  auxbuf[0xd] = '\0';
  auxbuf[0xe] = '\0';
  auxbuf[0xf] = '\0';
  auxbuf[0x10] = '\0';
  auxbuf[0x11] = '\0';
  auxbuf[0x12] = '\0';
  auxbuf[0x13] = '\0';
  auxbuf[0x14] = '\0';
  auxbuf[0x15] = '\0';
  auxbuf[0x16] = '\0';
  auxbuf[0x17] = '\0';
  auxbuf[0x18] = '\0';
  auxbuf[0x19] = '\0';
  auxbuf[0x1a] = '\0';
  auxbuf[0x1b] = '\0';
  auxbuf[0x1c] = '\0';
  auxbuf[0x1d] = '\0';
  auxbuf[0x1e] = '\0';
  auxbuf[0x1f] = '\0';
  auxbuf[0x20] = '\0';
  auxbuf[0x21] = '\0';
  auxbuf[0x22] = '\0';
  auxbuf[0x23] = '\0';
  auxbuf[0x24] = '\0';
  auxbuf[0x25] = '\0';
  auxbuf[0x26] = '\0';
  auxbuf[0x27] = '\0';
  auxbuf[0x28] = '\0';
  auxbuf[0x29] = '\0';
  auxbuf[0x2a] = '\0';
  auxbuf[0x2b] = '\0';
  auxbuf[0x2c] = '\0';
  auxbuf[0x2d] = '\0';
  auxbuf[0x2e] = '\0';
  auxbuf[0x2f] = '\0';
  auxbuf[0x30] = '\0';
  auxbuf[0x31] = '\0';
  auxbuf[0x32] = '\0';
  auxbuf[0x33] = '\0';
  auxbuf[0x34] = '\0';
  auxbuf[0x35] = '\0';
  auxbuf[0x36] = '\0';
  auxbuf[0x37] = '\0';
  auxbuf[0x38] = '\0';
  auxbuf[0x39] = '\0';
  auxbuf[0x3a] = '\0';
  auxbuf[0x3b] = '\0';
  auxbuf[0x3c] = '\0';
  auxbuf[0x3d] = '\0';
  auxbuf[0x3e] = '\0';
  auxbuf[0x3f] = '\0';
  auxbuf[0x40] = '\0';
  auxbuf[0x41] = '\0';
  auxbuf[0x42] = '\0';
  auxbuf[0x43] = '\0';
  auxbuf[0x44] = '\0';
  auxbuf[0x45] = '\0';
  auxbuf[0x46] = '\0';
  auxbuf[0x47] = '\0';
  auxbuf[0x48] = '\0';
  auxbuf[0x49] = '\0';
  auxbuf[0x4a] = '\0';
  auxbuf[0x4b] = '\0';
  auxbuf[0x4c] = '\0';
  auxbuf[0x4d] = '\0';
  auxbuf[0x4e] = '\0';
  auxbuf[0x4f] = '\0';
  auxbuf[0x50] = '\0';
  auxbuf[0x51] = '\0';
  auxbuf[0x52] = '\0';
  auxbuf[0x53] = '\0';
  auxbuf[0x54] = '\0';
  auxbuf[0x55] = '\0';
  auxbuf[0x56] = '\0';
  auxbuf[0x57] = '\0';
  auxbuf[0x58] = '\0';
  auxbuf[0x59] = '\0';
  auxbuf[0x5a] = '\0';
  auxbuf[0x5b] = '\0';
  auxbuf[0x5c] = '\0';
  auxbuf[0x5d] = '\0';
  auxbuf[0x5e] = '\0';
  auxbuf[0x5f] = '\0';
  auxbuf[0x60] = '\0';
  auxbuf[0x61] = '\0';
  auxbuf[0x62] = '\0';
  auxbuf[99] = '\0';
  auxbuf[100] = '\0';
  auxbuf[0x65] = '\0';
  auxbuf[0x66] = '\0';
  auxbuf[0x67] = '\0';
  auxbuf[0x68] = '\0';
  auxbuf[0x69] = '\0';
  auxbuf[0x6a] = '\0';
  auxbuf[0x6b] = '\0';
  auxbuf[0x6c] = '\0';
  auxbuf[0x6d] = '\0';
  auxbuf[0x6e] = '\0';
  auxbuf[0x6f] = '\0';
  auxbuf[0x70] = '\0';
  auxbuf[0x71] = '\0';
  auxbuf[0x72] = '\0';
  auxbuf[0x73] = '\0';
  auxbuf[0x74] = '\0';
  auxbuf[0x75] = '\0';
  auxbuf[0x76] = '\0';
  auxbuf[0x77] = '\0';
  auxbuf[0x78] = '\0';
  auxbuf[0x79] = '\0';
  auxbuf[0x7a] = '\0';
  auxbuf[0x7b] = '\0';
  auxbuf[0x7c] = '\0';
  auxbuf[0x7d] = '\0';
  auxbuf[0x7e] = '\0';
  auxbuf[0x7f] = '\0';
  local_116c = 0;
  iVar4 = clock_getres(4,(timespec *)&chrono_period.Frequency);
  if ((iVar4 == 0) && (iVar4 = clock_gettime(4,(timespec *)&chrono_period), iVar4 == 0)) {
    chrono_period.Suspended = 0;
    chrono_period.Finish.tv_sec = 0;
    chrono_period.Finish.tv_nsec = 0;
    chrono_period.Duration.tv_sec = 0;
    chrono_period.Duration.tv_nsec = 0;
  }
  local_1168 = 100;
  local_1164 = 0;
  bVar2 = false;
  do {
    bVar2 = !bVar2;
    while( true ) {
      if (chrono_period.Suspended == 0) {
        clock_gettime(4,(timespec *)&tt);
        chrono_period.Finish.tv_sec = tt;
        chrono_period.Finish.tv_nsec = lStack_1178;
        tt = ((tt + chrono_period.Duration.tv_sec) - chrono_period.Start.tv_sec) +
             (lStack_1178 + chrono_period.Duration.tv_nsec) / 1000000000;
        lStack_1178 = (lStack_1178 + chrono_period.Duration.tv_nsec) % 1000000000 -
                      chrono_period.Start.tv_nsec;
        if (lStack_1178 < 0) {
          tt = tt + ~((ulong)-lStack_1178 / 1000000000);
          lStack_1178 = lStack_1178 + 1000000000 + ((ulong)-lStack_1178 / 1000000000) * 1000000000;
        }
        chrono_period.Duration.tv_sec = tt;
        chrono_period.Duration.tv_nsec = lStack_1178;
      }
      iVar4 = clock_getres(4,(timespec *)&chrono_period.Frequency);
      if ((iVar4 == 0) && (iVar4 = clock_gettime(4,(timespec *)&chrono_period), iVar4 == 0)) {
        chrono_period.Suspended = 0;
        chrono_period.Duration.tv_sec = 0;
        chrono_period.Duration.tv_nsec = 0;
        chrono_period.Finish.tv_sec = 0;
        chrono_period.Finish.tv_nsec = 0;
      }
      if (bPauseSeanet == 0) break;
      if (!bVar2) {
        puts("Seanet paused.");
        DisconnectSeanetEx(&seanet);
      }
      if (bExit != 0) goto LAB_001a00f6;
      tt = 0;
      lStack_1178 = 100000000;
      nanosleep((timespec *)&tt,(timespec *)0x0);
      bVar2 = true;
    }
    if (bRestartSeanet == 0) {
      if (bVar2) goto LAB_0019f91d;
      local_116c = 0;
      iVar4 = GetHeadDataAndAuxDataSeanetEx(&seanet,scanline,&local_1160,auxbuf,&local_116c);
      if (iVar4 == 0) {
        tt = 0;
        iVar4 = gettimeofday(&local_1148,(__timezone_ptr_t)0x0);
        if (iVar4 != 0) {
          local_1148.tv_sec = 0;
          local_1148.tv_usec = 0;
        }
        tt = local_1148.tv_sec;
        ptVar8 = localtime((time_t *)&tt);
        if (ptVar8 == (tm *)0x0) {
          local_1158 = 0.0;
          uVar12 = 0;
          uVar10 = 0;
        }
        else {
          uVar10 = ptVar8->tm_min;
          uVar12 = ptVar8->tm_hour;
          local_1158 = (double)local_1148.tv_usec * 1e-06 + (double)ptVar8->tm_sec;
        }
        if (0 < local_116c) {
          iVar4 = __isoc99_sscanf(auxbuf,"%lfm\r",&distance);
          if (iVar4 == 1) {
            pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
            altitude_AGL = distance;
            pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
          }
          if (seanet.bSaveRawData != 0) {
            fprintf((FILE *)seanet.pfSaveFile,"%02d:%02d:%06.3f,%.100s\n",SUB84(local_1158,0),
                    (ulong)uVar12,(ulong)uVar10,auxbuf);
          }
        }
        local_1150 = uVar10;
        pthread_mutex_lock((pthread_mutex_t *)&SeanetDataCS);
        ptVar5 = tvs + index_scanlines;
        ptVar5->tv_sec = local_1148.tv_sec;
        ptVar5->tv_usec = local_1148.tv_usec;
        lVar11 = (long)index_scanlines;
        angles[lVar11] = local_1160;
        memcpy(scanlines + lVar11 * seanet.NBins,scanline,(long)seanet.NBins);
        index_scanlines = (index_scanlines + 1) % seanet.NSteps;
        pthread_mutex_unlock((pthread_mutex_t *)&SeanetDataCS);
        if (seanet.bSaveRawData != 0) {
          SOf[0] = 'D';
          SOf[1] = 'I';
          SOf[2] = 'G';
          SOf[3] = '\0';
          if (seanet.bDST == 0) {
            SOf[0] = 'S';
            SOf[1] = 'O';
            SOf[2] = 'N';
            SOf[3] = '\0';
          }
          fprintf((FILE *)seanet.pfSaveFile,
                  "%.3s,%02d:%02d:%06.3f,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d",SUB84(local_1158,0)
                  ,SOf,(ulong)uVar12,(ulong)local_1150,2,(ulong)(uint)seanet.HeadStatus,
                  (ulong)seanet.HeadHdCtrl.u,(ulong)(uint)seanet.HeadRangescale,
                  (ulong)(uint)seanet.HeadIGain,(ulong)(uint)seanet.HeadSlope,
                  (ulong)(uint)seanet.HeadADLow,(ulong)(uint)seanet.HeadADSpan,
                  (ulong)(uint)seanet.HeadLeftLim,(ulong)(uint)seanet.HeadRightLim,
                  (ulong)(uint)seanet.HeadSteps,
                  (ulong)(uint)((int)(local_1160 / 0.05625 + 3200.0 + 6400.0) % 0x1900),
                  (ulong)(uint)seanet.Dbytes);
          if (seanet.adc8on == 0) {
            if (0 < seanet.Dbytes) {
              lVar11 = 0;
              do {
                fprintf((FILE *)seanet.pfSaveFile,",%d",
                        (ulong)((uint)(scanline[lVar11 * 2 + 1] >> 4) |
                               scanline[lVar11 * 2] & 0xfffffff0));
                lVar11 = lVar11 + 1;
              } while (lVar11 < seanet.Dbytes);
            }
          }
          else if (0 < seanet.Dbytes) {
            lVar11 = 0;
            do {
              fprintf((FILE *)seanet.pfSaveFile,",%d",(ulong)scanline[lVar11]);
              lVar11 = lVar11 + 1;
            } while (lVar11 < seanet.Dbytes);
          }
          fputc(10,(FILE *)seanet.pfSaveFile);
          fflush((FILE *)seanet.pfSaveFile);
        }
        goto LAB_001a00d4;
      }
      puts("Connection to a Seanet lost.");
      DisconnectSeanetEx(&seanet);
      tt = (time_t)(local_1168 / 1000);
      lStack_1178 = (long)((local_1168 % 1000) * 1000000);
LAB_0019f942:
      nanosleep((timespec *)&tt,(timespec *)0x0);
      if (ExitOnErrorCount <= local_1164 + 1 && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_001a00f6:
        bVar3 = true;
        goto LAB_001a00f9;
      }
      bVar2 = false;
      bVar3 = true;
      local_1164 = local_1164 + 1;
    }
    else {
      if (!bVar2) {
        puts("Restarting a Seanet.");
        DisconnectSeanetEx(&seanet);
      }
      bRestartSeanet = 0;
LAB_0019f91d:
      iVar4 = ConnectSeanetEx(&seanet,"Seanet0.txt");
      if (iVar4 != 0) {
        tt = 1;
        lStack_1178 = 0;
        goto LAB_0019f942;
      }
      local_1168 = seanet.threadperiod;
      local_1148.tv_sec = 0;
      local_1148.tv_usec = 0;
      local_1160 = 0.0;
      memset(scanline,0,0x800);
      auxbuf[0] = '\0';
      auxbuf[1] = '\0';
      auxbuf[2] = '\0';
      auxbuf[3] = '\0';
      auxbuf[4] = '\0';
      auxbuf[5] = '\0';
      auxbuf[6] = '\0';
      auxbuf[7] = '\0';
      auxbuf[8] = '\0';
      auxbuf[9] = '\0';
      auxbuf[10] = '\0';
      auxbuf[0xb] = '\0';
      auxbuf[0xc] = '\0';
      auxbuf[0xd] = '\0';
      auxbuf[0xe] = '\0';
      auxbuf[0xf] = '\0';
      auxbuf[0x10] = '\0';
      auxbuf[0x11] = '\0';
      auxbuf[0x12] = '\0';
      auxbuf[0x13] = '\0';
      auxbuf[0x14] = '\0';
      auxbuf[0x15] = '\0';
      auxbuf[0x16] = '\0';
      auxbuf[0x17] = '\0';
      auxbuf[0x18] = '\0';
      auxbuf[0x19] = '\0';
      auxbuf[0x1a] = '\0';
      auxbuf[0x1b] = '\0';
      auxbuf[0x1c] = '\0';
      auxbuf[0x1d] = '\0';
      auxbuf[0x1e] = '\0';
      auxbuf[0x1f] = '\0';
      auxbuf[0x20] = '\0';
      auxbuf[0x21] = '\0';
      auxbuf[0x22] = '\0';
      auxbuf[0x23] = '\0';
      auxbuf[0x24] = '\0';
      auxbuf[0x25] = '\0';
      auxbuf[0x26] = '\0';
      auxbuf[0x27] = '\0';
      auxbuf[0x28] = '\0';
      auxbuf[0x29] = '\0';
      auxbuf[0x2a] = '\0';
      auxbuf[0x2b] = '\0';
      auxbuf[0x2c] = '\0';
      auxbuf[0x2d] = '\0';
      auxbuf[0x2e] = '\0';
      auxbuf[0x2f] = '\0';
      auxbuf[0x30] = '\0';
      auxbuf[0x31] = '\0';
      auxbuf[0x32] = '\0';
      auxbuf[0x33] = '\0';
      auxbuf[0x34] = '\0';
      auxbuf[0x35] = '\0';
      auxbuf[0x36] = '\0';
      auxbuf[0x37] = '\0';
      auxbuf[0x38] = '\0';
      auxbuf[0x39] = '\0';
      auxbuf[0x3a] = '\0';
      auxbuf[0x3b] = '\0';
      auxbuf[0x3c] = '\0';
      auxbuf[0x3d] = '\0';
      auxbuf[0x3e] = '\0';
      auxbuf[0x3f] = '\0';
      auxbuf[0x40] = '\0';
      auxbuf[0x41] = '\0';
      auxbuf[0x42] = '\0';
      auxbuf[0x43] = '\0';
      auxbuf[0x44] = '\0';
      auxbuf[0x45] = '\0';
      auxbuf[0x46] = '\0';
      auxbuf[0x47] = '\0';
      auxbuf[0x48] = '\0';
      auxbuf[0x49] = '\0';
      auxbuf[0x4a] = '\0';
      auxbuf[0x4b] = '\0';
      auxbuf[0x4c] = '\0';
      auxbuf[0x4d] = '\0';
      auxbuf[0x4e] = '\0';
      auxbuf[0x4f] = '\0';
      auxbuf[0x50] = '\0';
      auxbuf[0x51] = '\0';
      auxbuf[0x52] = '\0';
      auxbuf[0x53] = '\0';
      auxbuf[0x54] = '\0';
      auxbuf[0x55] = '\0';
      auxbuf[0x56] = '\0';
      auxbuf[0x57] = '\0';
      auxbuf[0x58] = '\0';
      auxbuf[0x59] = '\0';
      auxbuf[0x5a] = '\0';
      auxbuf[0x5b] = '\0';
      auxbuf[0x5c] = '\0';
      auxbuf[0x5d] = '\0';
      auxbuf[0x5e] = '\0';
      auxbuf[0x5f] = '\0';
      auxbuf[0x60] = '\0';
      auxbuf[0x61] = '\0';
      auxbuf[0x62] = '\0';
      auxbuf[99] = '\0';
      auxbuf[100] = '\0';
      auxbuf[0x65] = '\0';
      auxbuf[0x66] = '\0';
      auxbuf[0x67] = '\0';
      auxbuf[0x68] = '\0';
      auxbuf[0x69] = '\0';
      auxbuf[0x6a] = '\0';
      auxbuf[0x6b] = '\0';
      auxbuf[0x6c] = '\0';
      auxbuf[0x6d] = '\0';
      auxbuf[0x6e] = '\0';
      auxbuf[0x6f] = '\0';
      auxbuf[0x70] = '\0';
      auxbuf[0x71] = '\0';
      auxbuf[0x72] = '\0';
      auxbuf[0x73] = '\0';
      auxbuf[0x74] = '\0';
      auxbuf[0x75] = '\0';
      auxbuf[0x76] = '\0';
      auxbuf[0x77] = '\0';
      auxbuf[0x78] = '\0';
      auxbuf[0x79] = '\0';
      auxbuf[0x7a] = '\0';
      auxbuf[0x7b] = '\0';
      auxbuf[0x7c] = '\0';
      auxbuf[0x7d] = '\0';
      auxbuf[0x7e] = '\0';
      auxbuf[0x7f] = '\0';
      local_116c = 0;
      pthread_mutex_lock((pthread_mutex_t *)&SeanetConnectingCS);
      AdLow = seanet.ADLow;
      AdSpan = seanet.ADSpan;
      Steps = seanet.Resolution;
      NSteps = seanet.NSteps;
      Hdctrl = seanet.HdCtrl;
      StepAngleSize = seanet.StepAngleSize;
      NBins = seanet.NBins;
      alpha_max_err = seanet.alpha_max_err;
      d_max_err = seanet.d_max_err;
      rangescale = seanet.RangeScale;
      index_scanlines_prev = 0;
      index_scanlines = 0;
      free(tvs);
      free(angles);
      free(scanlines);
      sVar13 = (size_t)seanet.NSteps;
      ptVar5 = (timeval *)calloc(sVar13,0x10);
      tvs = ptVar5;
      pdVar6 = (double *)calloc(sVar13,8);
      angles = pdVar6;
      scanlines = (uchar *)calloc(sVar13 << 0xb,1);
      if (((ptVar5 == (timeval *)0x0) || (pdVar6 == (double *)0x0)) || (scanlines == (uchar *)0x0))
      {
        puts("Unable to allocate Seanet data.");
        pthread_mutex_unlock((pthread_mutex_t *)&SeanetConnectingCS);
LAB_001a0292:
        bVar3 = false;
        goto LAB_001a00f9;
      }
      pthread_mutex_unlock((pthread_mutex_t *)&SeanetConnectingCS);
      if (seanet.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)seanet.pfSaveFile);
        seanet.pfSaveFile = (FILE *)0x0;
      }
      if (seanet.bSaveRawData != 0) {
        if (seanet.szCfgFilePath[0] == '\0') {
          builtin_strncpy(szTemp,"seanet",7);
        }
        else {
          sprintf(szTemp,"%.127s",seanet.szCfgFilePath);
        }
        sVar13 = strlen(szTemp);
        iVar4 = (int)sVar13 + 1;
        uVar9 = sVar13 & 0xffffffff;
        do {
          if ((int)uVar9 < 1) goto LAB_0019fcdb;
          uVar1 = uVar9 - 1;
          iVar4 = iVar4 + -1;
          lVar11 = uVar9 - 1;
          uVar9 = uVar1;
        } while (szTemp[lVar11] != '.');
        if ((uVar1 != 0) && (iVar4 <= (int)sVar13)) {
          memset(szTemp + (uVar1 & 0xffffffff),0,sVar13 - (uVar1 & 0xffffffff));
        }
LAB_0019fcdb:
        pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
        pcVar7 = strtimeex_fns();
        sprintf(szSaveFilePath,"log/%.127s_%.64s.csv",szTemp,pcVar7);
        pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
        seanet.pfSaveFile = (FILE *)fopen(szSaveFilePath,"w");
        if ((FILE *)seanet.pfSaveFile == (FILE *)0x0) {
          puts("Unable to create Seanet data file.");
          goto LAB_001a0292;
        }
        fwrite("SOf,DateTime,Node,Status,Hdctrl,Rangescale,Gain,Slope,AdLow,AdSpan,LeftLim,RightLim,Steps,Bearing,Dbytes,Dbytes of DATA\n"
               ,0x78,1,(FILE *)seanet.pfSaveFile);
        fflush((FILE *)seanet.pfSaveFile);
      }
LAB_001a00d4:
      bVar2 = true;
      bVar3 = false;
    }
    if (bExit != 0) {
LAB_001a00f9:
      if (chrono_period.Suspended == 0) {
        clock_gettime(4,(timespec *)&tt);
        chrono_period.Finish.tv_sec = tt;
        chrono_period.Finish.tv_nsec = lStack_1178;
        tt = ((tt + chrono_period.Duration.tv_sec) - chrono_period.Start.tv_sec) +
             (lStack_1178 + chrono_period.Duration.tv_nsec) / 1000000000;
        lStack_1178 = (lStack_1178 + chrono_period.Duration.tv_nsec) % 1000000000 -
                      chrono_period.Start.tv_nsec;
        if (lStack_1178 < 0) {
          tt = tt + ~((ulong)-lStack_1178 / 1000000000);
          lStack_1178 = lStack_1178 + 1000000000 + ((ulong)-lStack_1178 / 1000000000) * 1000000000;
        }
        chrono_period.Duration.tv_sec = tt;
        chrono_period.Duration.tv_nsec = lStack_1178;
      }
      if (seanet.pfSaveFile != (FILE *)0x0) {
        fclose((FILE *)seanet.pfSaveFile);
        seanet.pfSaveFile = (FILE *)0x0;
      }
      pthread_mutex_lock((pthread_mutex_t *)&SeanetConnectingCS);
      free(scanlines);
      scanlines = (uchar *)0x0;
      free(angles);
      angles = (double *)0x0;
      free(tvs);
      tvs = (timeval *)0x0;
      pthread_mutex_unlock((pthread_mutex_t *)&SeanetConnectingCS);
      if (!bVar3) {
        DisconnectSeanetEx(&seanet);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE SeanetThread(void* pParam)
{
	SEANET seanet;
	//SEANETDATA seanetdata;
	struct timeval tv;
	double angle = 0;
	unsigned char scanline[MAX_NB_BYTES_SEANET];
	unsigned char auxbuf[128]; // For daisy-chained device.
	int nbauxbytes = 0; // For daisy-chained device.
	double distance = 0; // For daisy-chained echosounder.
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&seanet, 0, sizeof(SEANET));

	memset(&tv, 0, sizeof(tv));
	angle = 0;
	memset(scanline, 0, sizeof(scanline));
	memset(auxbuf, 0, sizeof(auxbuf));
	nbauxbytes = 0;

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		//mSleep(threadperiod);

		if (bPauseSeanet) 
		{
			if (bConnected)
			{
				printf("Seanet paused.\n");
				bConnected = FALSE;
				DisconnectSeanetEx(&seanet);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartSeanet) 
		{
			if (bConnected)
			{
				printf("Restarting a Seanet.\n");
				bConnected = FALSE;
				DisconnectSeanetEx(&seanet);
			}
			bRestartSeanet = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectSeanetEx(&seanet, "Seanet0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = seanet.threadperiod;

				memset(&tv, 0, sizeof(tv));
				angle = 0;
				memset(scanline, 0, sizeof(scanline));
				memset(auxbuf, 0, sizeof(auxbuf));
				nbauxbytes = 0;

				EnterCriticalSection(&SeanetConnectingCS);

				AdLow = seanet.ADLow;
				AdSpan = seanet.ADSpan;
				Steps = seanet.Resolution;
				NSteps = seanet.NSteps;
				Hdctrl = seanet.HdCtrl;
				StepAngleSize = seanet.StepAngleSize;
				NBins = seanet.NBins;

				alpha_max_err = seanet.alpha_max_err;
				d_max_err = seanet.d_max_err;
				rangescale = seanet.RangeScale;

				index_scanlines_prev = 0;
				index_scanlines = 0;

				free(tvs); free(angles); free(scanlines);
				tvs = NULL; angles = NULL; scanlines = NULL;
				tvs = (struct timeval*)calloc(seanet.NSteps, sizeof(struct timeval));
				angles = (double*)calloc(seanet.NSteps, sizeof(double));
				scanlines = (unsigned char*)calloc(seanet.NSteps*MAX_NB_BYTES_SEANET, sizeof(unsigned char));
				if ((tvs == NULL)||(angles == NULL)||(scanlines == NULL))
				{
					printf("Unable to allocate Seanet data.\n");
					LeaveCriticalSection(&SeanetConnectingCS);
					break;
				}

				LeaveCriticalSection(&SeanetConnectingCS);

				if (seanet.pfSaveFile != NULL)
				{
					fclose(seanet.pfSaveFile); 
					seanet.pfSaveFile = NULL;
				}
				if ((seanet.bSaveRawData)&&(seanet.pfSaveFile == NULL)) 
				{
					if (strlen(seanet.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", seanet.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "seanet");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					seanet.pfSaveFile = fopen(szSaveFilePath, "w");
					if (seanet.pfSaveFile == NULL) 
					{
						printf("Unable to create Seanet data file.\n");
						break;
					}
					fprintf(seanet.pfSaveFile, 
						"SOf,DateTime,Node,Status,Hdctrl,Rangescale,Gain,Slope,AdLow,AdSpan,LeftLim,RightLim,Steps,Bearing,Dbytes,Dbytes of DATA\n"
						); 
					fflush(seanet.pfSaveFile);
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			nbauxbytes = 0;
			// Swap commented line to enable/disable Aux device support...
			//if (GetHeadDataSeanetEx(&seanet, scanline, &angle) == EXIT_SUCCESS)
			if (GetHeadDataAndAuxDataSeanetEx(&seanet, scanline, &angle, auxbuf, &nbauxbytes) == EXIT_SUCCESS)
			{
				time_t tt = 0;
				struct tm* timeptr = NULL;
				int Hour = 0, Min = 0;
				double Seconds = 0;

				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				tt = tv.tv_sec;
				timeptr = localtime(&tt);
				if (timeptr != NULL)
				{
					Hour = timeptr->tm_hour;
					Min = timeptr->tm_min;
					Seconds = timeptr->tm_sec+0.000001*tv.tv_usec;
				}

				if (nbauxbytes > 0)
				{
					// Echosounder.
					if (sscanf((char*)auxbuf, "%lfm\r", &distance) == 1)
					{
						EnterCriticalSection(&StateVariablesCS);

						altitude_AGL = distance;

						LeaveCriticalSection(&StateVariablesCS);
					}

					if (seanet.bSaveRawData)
					{
						// Should remove the final LF from auxbuf (maybe in HeadDataReplyAndAuxDataSeanet()...) 
						// and end-of-line characters might be inconsistent with Seanet log files (especially on Linux)... 

						fprintf(seanet.pfSaveFile, "%02d:%02d:%06.3f,%.100s\n", Hour, Min, Seconds, (char*)auxbuf);
					}
				}

				EnterCriticalSection(&SeanetDataCS);

				tvs[index_scanlines] = tv;
				angles[index_scanlines] = angle;
				memcpy(scanlines+index_scanlines*seanet.NBins, scanline, seanet.NBins);
				index_scanlines++;
				index_scanlines = index_scanlines%seanet.NSteps;

				//// For direct waterfall display...
				//memmove(tvs+1, tvs, (seanet.NSteps-1)*sizeof(struct timeval));
				//tvs[0] = tv;
				//memmove(angles+1, angles, (seanet.NSteps-1)*sizeof(double));
				//angles[0] = angle;
				//memmove(scanlines+seanet.NBins, scanlines, (seanet.NSteps-1)*seanet.NBins);
				//memcpy(scanlines, scanline, seanet.NBins);

				LeaveCriticalSection(&SeanetDataCS);

				if (seanet.bSaveRawData)
				{
					char SOf[3+1];
					int Bearing = 0;

					if (seanet.bDST) strcpy(SOf, "DIG"); else strcpy(SOf, "SON");

					Bearing = ((int)(angle/0.05625+3200+6400))%6400; // Angle of the transducer (0..6399 in 1/16 Gradian units, 0.05625 = (1/16)*(9/10)).

					fprintf(seanet.pfSaveFile, "%.3s,%02d:%02d:%06.3f,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d,%d", 
						SOf, Hour, Min, Seconds, SERIAL_PORT_SONAR_NODE_NUMBER_SEANET, 
						seanet.HeadStatus, seanet.HeadHdCtrl.i, seanet.HeadRangescale, seanet.HeadIGain, 
						seanet.HeadSlope, seanet.HeadADLow, seanet.HeadADSpan, seanet.HeadLeftLim, seanet.HeadRightLim, 
						seanet.HeadSteps, Bearing, seanet.Dbytes
						);

					// We should take into account ADLow and ADSpan here?

					if (!seanet.adc8on)	
					{ 
						for (i = 0; i < seanet.Dbytes; i++)
						{
							int byte = ((scanline[2*i]/16)<<4)+scanline[2*i+1]/16;
							fprintf(seanet.pfSaveFile, ",%d", byte);
						}
					}
					else
					{ 
						for (i = 0; i < seanet.Dbytes; i++)
						{
							fprintf(seanet.pfSaveFile, ",%d", (int)scanline[i]);
						}
					}

					fprintf(seanet.pfSaveFile, "\n");

					fflush(seanet.pfSaveFile);
				}
			}
			else
			{
				printf("Connection to a Seanet lost.\n");
				bConnected = FALSE;
				DisconnectSeanetEx(&seanet);
				mSleep(threadperiod);
			}
		}

		//printf("SeanetThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	StopChronoQuick(&chrono_period);

	if (seanet.pfSaveFile != NULL)
	{
		fclose(seanet.pfSaveFile); 
		seanet.pfSaveFile = NULL;
	}

	EnterCriticalSection(&SeanetConnectingCS);
	free(scanlines);
	scanlines = NULL;
	free(angles);
	angles = NULL;
	free(tvs);
	tvs = NULL;
	LeaveCriticalSection(&SeanetConnectingCS);

	if (bConnected) DisconnectSeanetEx(&seanet);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}